

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# s1chord_angle.cc
# Opt level: O0

ostream * operator<<(ostream *os,S1ChordAngle a)

{
  ostream *poVar1;
  S1Angle a_00;
  ostream *os_local;
  S1ChordAngle a_local;
  
  os_local = (ostream *)a.length2_;
  a_00 = S1ChordAngle::ToAngle((S1ChordAngle *)&os_local);
  poVar1 = operator<<(os,a_00);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& os, S1ChordAngle a) {
  return os << a.ToAngle();
}